

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePickerPrivate::drawSectionItems
          (DateTimePickerPrivate *this,int section,QPainter *p,QStyleOption *opt)

{
  Section *pSVar1;
  int iVar2;
  Type TVar3;
  Section *pSVar4;
  ulong uVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  QColor QVar18;
  QRect r;
  QString text;
  QStringList values;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  QStyleOption *local_80;
  long local_78;
  QRect local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined2 local_4c;
  QArrayDataPointer<QString> local_48;
  
  if (section < 1) {
    iVar16 = 3;
  }
  else {
    lVar9 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + *(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->sectionWidth
                                + lVar9);
      lVar9 = lVar9 + 0x30;
    } while ((ulong)(uint)section * 0x30 != lVar9);
    iVar16 = iVar16 + 3;
  }
  iVar16 = iVar16 + this->itemSideMargin;
  local_80 = opt + 0x28;
  QPalette::brush((ColorGroup)local_80,Dark);
  QPainter::setPen((QColor *)p);
  lVar9 = (long)section;
  pSVar4 = (this->super_DateTimeParser).sections.d.ptr;
  local_78 = lVar9 * 0x30;
  pSVar1 = pSVar4 + lVar9;
  iVar6 = pSVar4[lVar9].offset;
  iVar2 = this->itemsMaxCount;
  uVar5 = pSVar4[lVar9].values.d.size;
  if ((long)uVar5 < (long)iVar2) {
    iVar11 = pSVar1->currentIndex;
    iVar12 = iVar11;
  }
  else {
    iVar12 = (uint)(0 < iVar6) + iVar2 / 2;
    iVar11 = pSVar1->currentIndex;
  }
  iVar10 = this->currentItemY + iVar6;
  if (0 < iVar12) {
    iVar13 = (this->itemHeight + this->itemTopMargin) * iVar12;
    do {
      if (iVar11 == 0) {
        iVar11 = (int)uVar5;
      }
      iVar11 = iVar11 + -1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    iVar10 = iVar10 - iVar13;
  }
  uVar15 = (ulong)((iVar2 + 1) - (uint)(iVar6 == 0));
  if ((long)uVar5 < (long)iVar2) {
    uVar15 = uVar5 & 0xffffffff;
  }
  if (0 < (int)uVar15) {
    TVar3 = pSVar1->type;
    iVar6 = pSVar1->sectionWidth + iVar16 + this->itemSideMargin * -2 + -7;
    do {
      local_84 = iVar10 + -1 + this->itemHeight;
      lVar8 = (long)iVar11;
      lVar9 = *(long *)((long)&(((this->super_DateTimeParser).sections.d.ptr)->values).d.ptr +
                       local_78);
      local_70._0_8_ = *(long *)(lVar9 + lVar8 * 0x18);
      local_70._8_8_ = *(undefined8 *)(lVar9 + 8 + lVar8 * 0x18);
      local_60 = *(undefined8 *)(lVar9 + 0x10 + lVar8 * 0x18);
      if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_70._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_70._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_90 = iVar16;
      local_8c = iVar10;
      local_88 = iVar6;
      if ((TVar3 == DaySectionLong) || (TVar3 == DaySectionShort)) {
        QString::split(&local_48,&local_70,0x20,0,1);
        plVar7 = (long *)QPalette::brush((ColorGroup)local_80,Dark);
        QVar18 = lighterColor((QColor *)(*plVar7 + 8),0x4b);
        local_58 = QVar18._0_8_;
        local_50 = QVar18.ct._4_4_;
        local_4c = QVar18.ct._8_2_;
        QPainter::setPen((QColor *)p);
        QPainter::drawText((QRect *)p,(int)&local_90,(QString *)0x101,(QRect *)local_48.ptr);
        QPalette::brush((ColorGroup)local_80,Dark);
        QPainter::setPen((QColor *)p);
        QPainter::drawText((QRect *)p,(int)&local_90,(QString *)0x102,
                           (QRect *)&((QRect *)((long)local_48.ptr + 0x10))->x2);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      }
      else {
        QPainter::drawText((QRect *)p,(int)&local_90,(QString *)0x101,&local_70);
      }
      bVar17 = *(int *)((long)&(((this->super_DateTimeParser).sections.d.ptr)->values).d.size +
                       local_78) + -1 == iVar11;
      iVar11 = iVar11 + 1;
      if (bVar17) {
        iVar11 = 0;
      }
      iVar10 = iVar10 + this->itemHeight + this->itemTopMargin;
      if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_70._0_8_,2,8);
        }
      }
      uVar14 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 0);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::drawSectionItems( int section, QPainter * p,
	const QStyleOption & opt )
{
	int x = 0;

	for( int i = 0; i < section; ++i )
		x += sections.at( i ).sectionWidth;

	x += 3 + itemSideMargin;

	p->setPen( opt.palette.color( QPalette::WindowText ) );

	const int yOffset = sections.at( section ).offset;

	int makePrevIndexCount = itemsMaxCount / 2;

	if( yOffset > 0 )
		++makePrevIndexCount;

	if( sections.at( section ).values.size() < itemsMaxCount )
		makePrevIndexCount = sections.at( section ).currentIndex;

	int index = sections.at( section ).currentIndex;
	int y = currentItemY + yOffset;

	for( int i = 0; i < makePrevIndexCount; ++i )
	{
		index = prevIndex( index, sections.at( section ).values.size() );
		y -= ( itemHeight + itemTopMargin );
	}

	int iterationsCount = ( yOffset == 0 ) ? itemsMaxCount : itemsMaxCount + 1;

	if( sections.at( section ).values.size() < itemsMaxCount )
		iterationsCount = sections.at( section ).values.size();

	const int textWidth = sections.at( section ).sectionWidth - 6 -
		itemSideMargin * 2;

	Section::Type type = sections.at( section ).type;

	for( int i = 0; i < iterationsCount; ++i )
	{
		const QRect r( x, y, textWidth, itemHeight );

		const QString text = sections.at( section ).values.at( index );

		if( type == Section::DaySectionShort ||
			type == Section::DaySectionLong )
		{
			QStringList values = text.split( QLatin1Char( ' ' ) );

			p->setPen(
				lighterColor( opt.palette.color( QPalette::WindowText ), 75 ) );
			p->drawText( r, Qt::AlignLeft | Qt::TextSingleLine, values.at( 0 ) );

			p->setPen( opt.palette.color( QPalette::WindowText ) );
			p->drawText( r, Qt::AlignRight | Qt::TextSingleLine, values.at( 1 ) );
		}
		else
			p->drawText( r, Qt::AlignLeft | Qt::TextSingleLine, text );

		index = nextIndex( index, sections.at( section ).values.size() );
		y += itemHeight + itemTopMargin;
	}
}